

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Glucose::SimpSolver::addClause_(SimpSolver *this,vec<Glucose::Lit> *ps)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  FILE *__s;
  uint *puVar4;
  uint uVar5;
  bool bVar6;
  undefined8 in_RAX;
  uint uVar7;
  int iVar8;
  int i_1;
  int i;
  long lVar9;
  undefined4 uStack_38;
  CRef cr;
  
  iVar8 = (this->super_Solver).clauses.sz;
  _uStack_38 = in_RAX;
  if ((this->use_rcheck == true) && (bVar6 = implied(this,ps), bVar6)) {
    return true;
  }
  bVar6 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar6) {
    if ((this->parsing == 0) && ((this->super_Solver).certifiedUNSAT == true)) {
      if ((this->super_Solver).vbyte == false) {
        lVar9 = 0;
        while( true ) {
          __s = (FILE *)(this->super_Solver).certifiedOutput;
          if (ps->sz <= lVar9) break;
          uVar3 = ps->data[lVar9].x;
          uVar7 = (int)uVar3 >> 1;
          uVar5 = ~uVar7;
          if ((uVar3 & 1) == 0) {
            uVar5 = uVar7 + 1;
          }
          fprintf(__s,"%i ",(ulong)uVar5);
          lVar9 = lVar9 + 1;
        }
        fwrite("0\n",2,1,__s);
      }
      else {
        Solver::write_char(&this->super_Solver,'a');
        for (lVar9 = 0; lVar9 < ps->sz; lVar9 = lVar9 + 1) {
          Solver::write_lit(&this->super_Solver,ps->data[lVar9].x + 2);
        }
        Solver::write_lit(&this->super_Solver,0);
      }
    }
    bVar6 = true;
    if ((this->use_simplification == true) &&
       (iVar2 = (this->super_Solver).clauses.sz, iVar2 == iVar8 + 1)) {
      uVar3 = (this->super_Solver).clauses.data[(long)iVar2 + -1];
      _uStack_38 = CONCAT44(uVar3,uStack_38);
      puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      Queue<unsigned_int>::insert(&this->subsumption_queue,uVar3);
      for (lVar9 = 0; lVar9 < (int)puVar4[(ulong)uVar3 + 1]; lVar9 = lVar9 + 1) {
        vec<unsigned_int>::push
                  ((this->occurs).occs.data + ((int)puVar4[(ulong)uVar3 + lVar9 + 3] >> 1),&cr);
        piVar1 = (this->n_occ).data + (int)puVar4[(ulong)uVar3 + lVar9 + 3];
        *piVar1 = *piVar1 + 1;
        (this->touched).data[(int)puVar4[(ulong)uVar3 + lVar9 + 3] >> 1] = '\x01';
        this->n_touched = this->n_touched + 1;
        iVar8 = (int)puVar4[(ulong)uVar3 + lVar9 + 3] >> 1;
        if ((iVar8 < (this->elim_heap).indices.sz) && (-1 < (this->elim_heap).indices.data[iVar8]))
        {
          Heap<Glucose::SimpSolver::ElimLt>::increase(&this->elim_heap,iVar8);
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif
    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if(!parsing && certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < ps.size(); i++)
                write_lit(2*(var(ps[i])+1) + sign(ps[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[toInt(c[i])]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}